

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::BindTargetListSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,BindTargetListSyntax *this,size_t index)

{
  Token token;
  SyntaxNode *local_50;
  size_t index_local;
  BindTargetListSyntax *this_local;
  
  if (index == 0) {
    token.kind = (this->colon).kind;
    token._2_1_ = (this->colon).field_0x2;
    token.numFlags.raw = (this->colon).numFlags.raw;
    token.rawLen = (this->colon).rawLen;
    token.info = (this->colon).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 1) {
    local_50 = (SyntaxNode *)0x0;
    if (this != (BindTargetListSyntax *)0xffffffffffffffe0) {
      local_50 = &(this->targets).super_SyntaxListBase.super_SyntaxNode;
    }
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,local_50);
  }
  else {
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax BindTargetListSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return colon;
        case 1: return &targets;
        default: return nullptr;
    }
}